

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gerr.hpp
# Opt level: O2

ostream * gerr::details::operator<<(ostream *os,IError *err)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar4;
  undefined4 extraout_var_00;
  string local_50;
  char *pcVar3;
  
  do {
    iVar1 = (*err->_vptr_IError[2])(err);
    iVar2 = (*err->_vptr_IError[3])(err);
    pcVar3 = (char *)CONCAT44(extraout_var,iVar2);
    if (((pcVar3 == (char *)0x0) || (iVar1 == 0)) || (*pcVar3 == '\0')) {
      poVar4 = os;
      if (iVar1 == 0) goto LAB_001038dc;
      std::__cxx11::to_string(&local_50,iVar1);
      std::operator<<(os,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,iVar1);
      poVar4 = std::operator<<(poVar4,":");
LAB_001038dc:
      std::operator<<(poVar4,pcVar3);
    }
    iVar1 = (*err->_vptr_IError[4])(err);
    if (*(long *)CONCAT44(extraout_var_00,iVar1) == 0) {
      return os;
    }
    std::operator<<(os,":");
    err = *(IError **)CONCAT44(extraout_var_00,iVar1);
  } while( true );
}

Assistant:

std::ostream& operator<<(std::ostream& os, IError const& err) {
    for (auto p = &err;;) {
      auto const c = p->Code();
      auto const msg = p->Message();
      auto const hasMsg = msg != nullptr && msg[0] != '\0';
      if (c != 0 && hasMsg) {
        // 同时持有非 0 的 code 和 message，同时打印
        os << c << ":" << msg;
      } else if (c == 0) {
        // 如果 code == 0，就只打印 message
        os << msg;
      } else {  // c != 0 && !hasMsg
        // 如果 message 是空，就只打印 code
        os << std::to_string(c);
      }
      auto const& next = p->Cause();
      if (next != nullptr) {
        os << ":";
        p = next.get();
      } else {
        break;
      }
    }
    return os;
  }